

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

void __thiscall absl::lts_20240722::Cord::Clear(Cord *this)

{
  RefcountAndFlags *pRVar1;
  uint uVar2;
  byte bVar3;
  CordRep *pCVar4;
  CordzInfo *pCVar5;
  
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
    pCVar5 = cord_internal::InlineData::cordz_info((InlineData *)this);
    if (pCVar5 != (CordzInfo *)0x0) {
      absl::lts_20240722::cord_internal::CordzInfo::Untrack();
    }
  }
  bVar3 = (this->contents_).data_.rep_.field_0.data[0];
  pCVar4 = (this->contents_).data_.rep_.field_0.as_tree.rep;
  (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
  (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  if (pCVar4 != (CordRep *)0x0 && (bVar3 & 1) != 0) {
    LOCK();
    pRVar1 = &pCVar4->refcount;
    uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar2 & 1) == 0 && (int)uVar2 < 1) {
      __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0xaa,
                    "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
    }
    if (uVar2 == 2) {
      absl::lts_20240722::cord_internal::CordRep::Destroy(pCVar4);
      return;
    }
  }
  return;
}

Assistant:

void Cord::Clear() {
  if (CordRep* tree = contents_.clear()) {
    CordRep::Unref(tree);
  }
}